

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O3

void __thiscall
so_5::disp::active_group::impl::
dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
::disp_data_source_t::distribute(disp_data_source_t *this,mbox_t *mbox)

{
  dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
  *pdVar1;
  int iVar2;
  _Rb_tree_node_base *p_Var3;
  mutex *__mutex;
  size_t agent_count;
  suffix_t local_40;
  suffix_t local_38;
  
  __mutex = &this->m_dispatcher->m_lock;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  local_40 = stats::suffixes::disp_active_group_count();
  local_38.m_value =
       (char *)(this->m_dispatcher->m_groups)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  so_5::impl::instantiator_and_sender_base<so_5::stats::messages::quantity<unsigned_long>,false>::
  send<so_5::stats::prefix_t&,so_5::stats::suffix_t,unsigned_long>
            (mbox,&this->m_base_prefix,&local_40,(unsigned_long *)&local_38);
  local_40.m_value = (char *)0x0;
  pdVar1 = this->m_dispatcher;
  for (p_Var3 = (pdVar1->m_groups)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(pdVar1->m_groups)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    distribute_value_for_work_thread
              (this,mbox,(string *)(p_Var3 + 1),(thread_with_refcounter_t *)(p_Var3 + 2));
    local_40.m_value = local_40.m_value + (long)p_Var3[2]._M_left;
  }
  local_38 = stats::suffixes::agent_count();
  so_5::impl::instantiator_and_sender_base<so_5::stats::messages::quantity<unsigned_long>,false>::
  send<so_5::stats::prefix_t&,so_5::stats::suffix_t,unsigned_long&>
            (mbox,&this->m_base_prefix,&local_38,(unsigned_long *)&local_40);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return;
}

Assistant:

virtual void
				distribute( const so_5::mbox_t & mbox )
					{
						std::lock_guard< std::mutex > lock{ m_dispatcher.m_lock };

						so_5::send< stats::messages::quantity< std::size_t > >(
								mbox,
								m_base_prefix,
								stats::suffixes::disp_active_group_count(),
								m_dispatcher.m_groups.size() );

						std::size_t agent_count = 0;
						for( const auto & p : m_dispatcher.m_groups )
							{
								distribute_value_for_work_thread(
										mbox,
										p.first,
										p.second );

								agent_count += p.second.m_user_agent;
							}

						so_5::send< stats::messages::quantity< std::size_t > >(
								mbox,
								m_base_prefix,
								stats::suffixes::agent_count(),
								agent_count );
					}